

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa.c
# Opt level: O0

exr_result_t internal_exr_apply_dwaa(exr_encode_pipeline_t *encode)

{
  exr_decode_pipeline_t *in_RDI;
  DwaCompressor dwaa;
  exr_result_t rv;
  DwaCompressor *in_stack_000005c8;
  exr_encode_pipeline_t *encode_00;
  DwaCompressor *me;
  DwaCompressor *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff48;
  size_t *in_stack_ffffffffffffff50;
  void **in_stack_ffffffffffffff58;
  exr_transcoding_pipeline_buffer_id_t in_stack_ffffffffffffff64;
  exr_encode_pipeline_t *in_stack_ffffffffffffff68;
  exr_result_t local_c;
  
  encode_00 = (exr_encode_pipeline_t *)&in_RDI->scratch_alloc_size_2;
  me = (DwaCompressor *)&in_RDI->alloc_fn;
  internal_exr_huf_compress_spare_bytes();
  local_c = internal_encode_alloc_buffer
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58
                       ,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (local_c == 0) {
    local_c = DwaCompressor_construct
                        (in_stack_ffffffffffffff38,(AcCompression)((ulong)me >> 0x20),encode_00,
                         in_RDI);
    if (local_c == 0) {
      local_c = DwaCompressor_compress(in_stack_000005c8);
    }
    DwaCompressor_destroy(me);
  }
  return local_c;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

exr_result_t
internal_exr_apply_dwaa (exr_encode_pipeline_t* encode)
{
    exr_result_t  rv;
    DwaCompressor dwaa;
    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        internal_exr_huf_compress_spare_bytes ());
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = DwaCompressor_construct (&dwaa, STATIC_HUFFMAN, encode, NULL);
        if (rv == EXR_ERR_SUCCESS) rv = DwaCompressor_compress (&dwaa);

        DwaCompressor_destroy (&dwaa);
    }

    return rv;
}